

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFModulusPoly.cpp
# Opt level: O1

ModulusPoly * __thiscall
ZXing::Pdf417::ModulusPoly::multiply
          (ModulusPoly *__return_storage_ptr__,ModulusPoly *this,int scalar)

{
  int iVar1;
  ModulusGF *pMVar2;
  pointer piVar3;
  pointer piVar4;
  pointer psVar5;
  vector<int,_std::allocator<int>_> *__x;
  long lVar6;
  int iVar7;
  size_type __n;
  vector<int,_std::allocator<int>_> product;
  allocator_type local_49;
  vector<int,_std::allocator<int>_> local_48;
  
  if (scalar == 1) {
    __return_storage_ptr__->_field = this->_field;
    __x = &this->_coefficients;
  }
  else {
    if (scalar != 0) {
      piVar3 = (this->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      piVar4 = (this->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      __n = (long)piVar3 - (long)piVar4 >> 2;
      std::vector<int,_std::allocator<int>_>::vector(&local_48,__n,&local_49);
      if (piVar3 != piVar4) {
        pMVar2 = this->_field;
        piVar3 = (this->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar6 = 0;
        do {
          iVar7 = 0;
          if ((scalar != 0) && (iVar1 = piVar3[lVar6], iVar1 != 0)) {
            psVar5 = (pMVar2->_logTable).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar7 = (int)(pMVar2->_expTable).super__Vector_base<short,_std::allocator<short>_>.
                         _M_impl.super__Vector_impl_data._M_start
                         [(long)psVar5[iVar1] + (long)psVar5[scalar]];
          }
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar6] = iVar7;
          lVar6 = lVar6 + 1;
        } while (__n + (__n == 0) != lVar6);
      }
      ModulusPoly(__return_storage_ptr__,this->_field,&local_48);
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start == (pointer)0x0) {
        return __return_storage_ptr__;
      }
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
      return __return_storage_ptr__;
    }
    pMVar2 = this->_field;
    __return_storage_ptr__->_field = (pMVar2->_zero)._field;
    __x = &(pMVar2->_zero)._coefficients;
  }
  std::vector<int,_std::allocator<int>_>::vector(&__return_storage_ptr__->_coefficients,__x);
  return __return_storage_ptr__;
}

Assistant:

ModulusPoly
ModulusPoly::multiply(int scalar) const
{
	if (scalar == 0) {
		return _field->zero();
	}
	if (scalar == 1) {
		return *this;
	}
	size_t size = _coefficients.size();
	std::vector<int> product(size);
	for (size_t i = 0; i < size; i++) {
		product[i] = _field->multiply(_coefficients[i], scalar);
	}
	return ModulusPoly(*_field, product);
}